

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

void expr_free(expr_t *expr)

{
  list_node_t *local_20;
  list_node_t *node;
  expr_t *child;
  expr_t *expr_local;
  
  if (expr->param != (thanm_param_t *)0x0) {
    thanm_param_free(expr->param);
  }
  for (local_20 = (expr->children).head; local_20 != (list_node_t *)0x0; local_20 = local_20->next)
  {
    expr_free((expr_t *)local_20->data);
  }
  list_free_nodes(&expr->children);
  free(expr);
  return;
}

Assistant:

void
expr_free(
    expr_t* expr
) {
    if (expr->param)
        thanm_param_free(expr->param);

    expr_t* child;
    list_for_each(&expr->children, child)
        expr_free(child);

    list_free_nodes(&expr->children);
    free(expr);
}